

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void C_ArchiveCVars(FConfigFile *f,uint32 filter)

{
  FBaseCVar **ppFVar1;
  int iVar2;
  undefined4 extraout_var;
  FBaseCVar *pFVar3;
  
  pFVar3 = CVars;
  if (CVars != (FBaseCVar *)0x0) {
    do {
      if ((pFVar3->Flags & 0x3507) == filter) {
        iVar2 = (*pFVar3->_vptr_FBaseCVar[4])(pFVar3,3);
        FConfigFile::SetValueForKey(f,pFVar3->Name,(char *)CONCAT44(extraout_var,iVar2),false);
      }
      ppFVar1 = &pFVar3->m_Next;
      pFVar3 = *ppFVar1;
    } while (*ppFVar1 != (FBaseCVar *)0x0);
  }
  return;
}

Assistant:

void C_ArchiveCVars (FConfigFile *f, uint32 filter)
{
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		if ((cvar->Flags &
			(CVAR_GLOBALCONFIG|CVAR_ARCHIVE|CVAR_MOD|CVAR_AUTO|CVAR_USERINFO|CVAR_SERVERINFO|CVAR_NOSAVE))
			== filter)
		{
			UCVarValue val;
			val = cvar->GetGenericRep (CVAR_String);
			f->SetValueForKey (cvar->GetName (), val.String);
		}
		cvar = cvar->m_Next;
	}
}